

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void neon_store_element64(TCGContext_conflict1 *tcg_ctx,int reg,int ele,MemOp size,TCGv_i64 var)

{
  long offset_00;
  long offset;
  TCGv_i64 var_local;
  MemOp size_local;
  int ele_local;
  int reg_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  offset_00 = neon_element_offset(reg,ele,size);
  switch(size) {
  case MO_8:
    tcg_gen_st8_i64(tcg_ctx,var,tcg_ctx->cpu_env,offset_00);
    break;
  case MO_16:
    tcg_gen_st16_i64(tcg_ctx,var,tcg_ctx->cpu_env,offset_00);
    break;
  case MO_32:
    tcg_gen_st32_i64(tcg_ctx,var,tcg_ctx->cpu_env,offset_00);
    break;
  case MO_64:
    tcg_gen_st_i64_aarch64(tcg_ctx,var,tcg_ctx->cpu_env,offset_00);
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate.c"
               ,0x505,(char *)0x0);
  }
  return;
}

Assistant:

static void neon_store_element64(TCGContext *tcg_ctx, int reg, int ele, MemOp size, TCGv_i64 var)
{
    long offset = neon_element_offset(reg, ele, size);

    switch (size) {
    case MO_8:
        tcg_gen_st8_i64(tcg_ctx, var, tcg_ctx->cpu_env, offset);
        break;
    case MO_16:
        tcg_gen_st16_i64(tcg_ctx, var, tcg_ctx->cpu_env, offset);
        break;
    case MO_32:
        tcg_gen_st32_i64(tcg_ctx, var, tcg_ctx->cpu_env, offset);
        break;
    case MO_64:
        tcg_gen_st_i64(tcg_ctx, var, tcg_ctx->cpu_env, offset);
        break;
    default:
        g_assert_not_reached();
        break;
    }
}